

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O1

PropertyQueryFlags __thiscall
Js::CustomExternalWrapperObject::GetPropertyQuery
          (CustomExternalWrapperObject *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  ImplicitCallFlags IVar1;
  ScriptContext *scriptContext;
  DynamicObject *aValue;
  code *pcVar2;
  Var *ppvVar3;
  bool bVar4;
  BOOL BVar5;
  PropertyQueryFlags PVar6;
  Attributes attributes;
  Type TVar7;
  JavascriptFunction *function;
  JavascriptMethod p_Var8;
  undefined4 *puVar9;
  RecyclableObject *this_00;
  RecyclableObject *pRVar10;
  ThreadContext *pTVar11;
  Recycler *this_01;
  PropertyDescriptor *this_02;
  PropertyDescriptor local_d8;
  undefined1 local_a8 [8];
  PropertyDescriptor result;
  Var isPropertyNameNumeric;
  Var *local_68;
  Var local_60;
  Var local_58;
  Type local_50;
  Type TStack_4f;
  undefined6 uStack_4e;
  Var local_48;
  ThreadContext *local_40;
  bool local_31;
  
  local_68 = value;
  BVar5 = VerifyObjectAlive(this);
  if (BVar5 == 0) {
    return Property_NotFound;
  }
  local_60 = originalInstance;
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_a8);
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  PVar6 = Property_NotFound;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  local_40 = requestContext->threadContext;
  BVar5 = EnsureInitialized(this,requestContext);
  if (BVar5 == 0) goto LAB_00b41040;
  aValue = ((this->super_DynamicObject).super_RecyclableObject.type.ptr[1].propertyCache.ptr)->
           elements[0].prototypeObjectWithProperty.ptr;
  if (aValue == (DynamicObject *)0x0) {
    function = (JavascriptFunction *)0x0;
  }
  else {
    function = VarTo<Js::JavascriptFunction>(aValue);
  }
  if (function != (JavascriptFunction *)0x0) {
    this_01 = requestContext->recycler;
    bVar4 = Memory::Recycler::IsHeapEnumInProgress(this_01);
    if (!bVar4) {
      local_58 = GetName((CustomExternalWrapperObject *)this_01,requestContext,propertyId,
                         (Var *)&result.Configurable,&isPropertyNameNumeric);
      pTVar11 = local_40;
      if (info != (PropertyValueInfo *)0x0) {
        info->m_instance = (RecyclableObject *)this;
        info->m_propertyIndex = 0xffff;
        info->m_attributes = '\0';
        info->flags = InlineCacheNoFlags;
        *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag | disablePrototypeCacheFlag;
      }
      local_50 = result.Configurable;
      TStack_4f = result.fromProxy;
      uStack_4e = result._42_6_;
      local_48 = isPropertyNameNumeric;
      local_31 = local_40->reentrancySafeOrHandled;
      local_40->reentrancySafeOrHandled = true;
      attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
      bVar4 = ThreadContext::HasNoSideEffect(pTVar11,(RecyclableObject *)function,attributes);
      pTVar11 = local_40;
      if (bVar4) {
        ThreadContext::CheckAndResetReentrancySafeOrHandled(local_40);
        if (pTVar11->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
        CheckIsExecutable((RecyclableObject *)function,p_Var8);
        p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
        pRVar10 = (RecyclableObject *)
                  (*p_Var8)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,
                            0x2000004,this,local_58,_local_50,local_48);
        bVar4 = ThreadContext::IsOnStack(pRVar10);
LAB_00b40d78:
        if (bVar4 != false) {
          pTVar11->implicitCallFlags = pTVar11->implicitCallFlags | ImplicitCall_Accessor;
        }
      }
      else if ((local_40->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag)
      {
        if ((attributes & HasNoSideEffect) != None) {
          ThreadContext::CheckAndResetReentrancySafeOrHandled(local_40);
          if (pTVar11->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
          CheckIsExecutable((RecyclableObject *)function,p_Var8);
          p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
          pRVar10 = (RecyclableObject *)
                    (*p_Var8)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,
                              0x2000004,this,local_58,_local_50,local_48);
          bVar4 = ThreadContext::IsOnStack(pRVar10);
          goto LAB_00b40d78;
        }
        IVar1 = local_40->implicitCallFlags;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(local_40);
        if (local_40->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
        CheckIsExecutable((RecyclableObject *)function,p_Var8);
        p_Var8 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
        pRVar10 = (RecyclableObject *)
                  (*p_Var8)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,
                            0x2000004,this,local_58,_local_50,local_48);
        local_40->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
        pTVar11 = local_40;
      }
      else {
        local_40->implicitCallFlags = local_40->implicitCallFlags | ImplicitCall_Accessor;
        pRVar10 = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                    super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
                  undefinedValue.ptr;
      }
      pTVar11->reentrancySafeOrHandled = local_31;
      if (pRVar10 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_00b41100;
        *puVar9 = 0;
      }
      if (((ulong)pRVar10 & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)pRVar10 & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar4) goto LAB_00b41100;
        *puVar9 = 0;
      }
      if ((ulong)pRVar10 >> 0x32 == 0 && ((ulong)pRVar10 & 0xffff000000000000) != 0x1000000000000) {
        this_00 = UnsafeVarTo<Js::RecyclableObject>(pRVar10);
        if (this_00 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar4) goto LAB_00b41100;
          *puVar9 = 0;
        }
        TVar7 = ((this_00->type).ptr)->typeId;
        if (0x57 < (int)TVar7) {
          BVar5 = RecyclableObject::IsExternal(this_00);
          if (BVar5 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar9 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar4) {
LAB_00b41100:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar9 = 0;
          }
          goto LAB_00b4101d;
        }
      }
      else {
LAB_00b4101d:
        TVar7 = TypeIds_FirstNumberType;
      }
      if (TVar7 == TypeIds_Undefined) {
        PVar6 = Property_NotFound;
      }
      else {
        PropertyDescriptor::SetValue((PropertyDescriptor *)local_a8,pRVar10);
        PVar6 = Property_Found;
      }
      goto LAB_00b41040;
    }
  }
  ppvVar3 = local_68;
  PVar6 = DynamicObject::GetPropertyQuery
                    (&this->super_DynamicObject,local_60,propertyId,local_68,info,requestContext);
  PVar6 = (PropertyQueryFlags)(PVar6 == Property_Found);
  PropertyDescriptor::SetValue((PropertyDescriptor *)local_a8,*ppvVar3);
LAB_00b41040:
  if (PVar6 == Property_NotFound) {
    pRVar10 = ScriptContext::GetMissingPropertyResult(requestContext);
  }
  else {
    this_02 = &local_d8;
    PropertyDescriptor::PropertyDescriptor(&local_d8,(PropertyDescriptor *)local_a8);
    pRVar10 = (RecyclableObject *)
              GetValueFromDescriptor
                        ((CustomExternalWrapperObject *)this_02,local_60,&local_d8,requestContext);
  }
  *local_68 = pRVar10;
  return PVar6;
}

Assistant:

Js::PropertyQueryFlags CustomExternalWrapperObject::GetPropertyQuery(Js::Var originalInstance, Js::PropertyId propertyId, Js::Var* value, Js::PropertyValueInfo* info, Js::ScriptContext* requestContext)
{
    if (!this->VerifyObjectAlive()) return Js::PropertyQueryFlags::Property_NotFound;
    Js::PropertyDescriptor result;

    auto fn = [&](Js::RecyclableObject* object)-> BOOL {
        BOOL found = JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::GetPropertyQuery(originalInstance, propertyId, value, info, requestContext));
        result.SetValue(*value);
        return found;
    };
    auto getPropertyName = [&](Js::ScriptContext * requestContext, Js::Var * isPropertyNameNumeric, Js::Var * propertyNameNumericValue)->Js::Var
    {
        return GetName(requestContext, propertyId, isPropertyNameNumeric, propertyNameNumericValue);
    };
    BOOL foundProperty = GetPropertyTrap(originalInstance, &result, fn, getPropertyName, requestContext, info);
    if (!foundProperty)
    {
        *value = requestContext->GetMissingPropertyResult();
    }
    else
    {
        *value = GetValueFromDescriptor(originalInstance, result, requestContext);
    }
    return Js::JavascriptConversion::BooleanToPropertyQueryFlags(foundProperty);
}